

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_accent_type.c
# Opt level: O1

char get_token_from_string(char *str,int *index,char *buff)

{
  int iVar1;
  byte bVar2;
  ulong uVar3;
  
  bVar2 = str[*index];
  uVar3 = 0;
  if (bVar2 != 0) {
    while ((0x1b < bVar2 - 0x25 || ((0x8000401U >> (bVar2 - 0x25 & 0x1f) & 1) == 0))) {
      if (bVar2 == 0) goto LAB_0014b3ef;
      buff[uVar3] = bVar2;
      uVar3 = uVar3 + 1;
      iVar1 = *index;
      *index = iVar1 + 1;
      bVar2 = str[(long)iVar1 + 1];
    }
    *index = *index + 1;
  }
LAB_0014b3ef:
  buff[uVar3 & 0xffffffff] = '\0';
  return bVar2;
}

Assistant:

static char get_token_from_string(const char *str, int *index, char *buff)
{
   char c;
   int i = 0;

   c = str[(*index)];
   if (c != '\0') {
      while (c != '%' && c != '@' && c != '/' && c != '\0') {
         buff[i++] = c;
         c = str[++(*index)];
      }
      if (c == '%' || c == '@' || c == '/')
         (*index)++;
   }
   buff[i] = '\0';
   return c;
}